

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSatG.c
# Opt level: O2

void Cec3_ManCreateClasses(Gia_Man_t *p,Cec3_Man_t *pMan)

{
  size_t __size;
  int Num;
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  Gia_Rpr_t *pGVar5;
  int *piVar6;
  void *__s;
  Gia_Obj_t *pGVar7;
  word *pSim;
  abctime aVar8;
  abctime aVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  uint uVar13;
  uint nTableSize;
  
  iVar10 = p->nSimWords;
  if (p->pReprs != (Gia_Rpr_t *)0x0) {
    free(p->pReprs);
    p->pReprs = (Gia_Rpr_t *)0x0;
  }
  free(p->pNexts);
  uVar3 = p->nObjs;
  pGVar5 = (Gia_Rpr_t *)calloc((long)(int)uVar3,4);
  p->pReprs = pGVar5;
  __size = (long)(int)uVar3 * 4;
  piVar6 = (int *)malloc(__size);
  memset(piVar6,0xff,__size);
  p->pNexts = piVar6;
  uVar13 = uVar3 - 1;
  do {
    do {
      nTableSize = uVar13 + 1;
      uVar2 = uVar13 & 1;
      uVar13 = nTableSize;
    } while (uVar2 != 0);
    uVar11 = 3;
    do {
      iVar4 = (int)uVar11;
      if (nTableSize < (uint)(iVar4 * iVar4)) {
        __s = malloc((long)(int)nTableSize << 2);
        memset(__s,0xff,(long)(int)nTableSize << 2);
        lVar12 = 0;
        goto LAB_005271e6;
      }
      uVar1 = (ulong)nTableSize % uVar11;
      uVar11 = (ulong)(iVar4 + 2);
    } while ((int)uVar1 != 0);
  } while( true );
LAB_005271e6:
  if ((int)uVar3 <= lVar12) {
LAB_00527282:
    while (0 < (int)uVar3) {
      uVar3 = uVar3 - 1;
      uVar11 = (ulong)(uint)p->pReprs[uVar3] & 0xfffffff;
      if (uVar11 != 0xfffffff) {
        piVar6 = p->pNexts;
        piVar6[uVar3] = piVar6[uVar11];
        piVar6[uVar11] = uVar3;
      }
    }
    free(__s);
    aVar8 = Abc_Clock();
    for (iVar10 = 0; iVar10 < p->nObjs; iVar10 = iVar10 + 1) {
      iVar4 = Gia_ObjIsHead(p,iVar10);
      if (iVar4 != 0) {
        Cec3_ManSimClassRefineOne(p,iVar10);
      }
    }
    aVar9 = Abc_Clock();
    pMan->timeRefine = pMan->timeRefine + (aVar9 - aVar8);
    return;
  }
  iVar4 = (int)lVar12;
  pGVar7 = Gia_ManObj(p,iVar4);
  if (pGVar7 == (Gia_Obj_t *)0x0) {
    uVar3 = p->nObjs;
    goto LAB_00527282;
  }
  p->pReprs[lVar12] = (Gia_Rpr_t)((uint)p->pReprs[lVar12] | 0xfffffff);
  if (-1 < (int)*(uint *)pGVar7 || (~*(uint *)pGVar7 & 0x1fffffff) == 0) {
    pSim = Cec3_ObjSim(p,iVar4);
    uVar3 = Cec3_ManSimHashKey(pSim,iVar10,nTableSize);
    if (((int)uVar3 < 0) || ((int)nTableSize <= (int)uVar3)) {
      __assert_fail("Key >= 0 && Key < nTableSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/cec/cecSatG.c"
                    ,0x273,"void Cec3_ManCreateClasses(Gia_Man_t *, Cec3_Man_t *)");
    }
    Num = *(int *)((long)__s + (ulong)uVar3 * 4);
    if (Num == -1) {
      *(int *)((long)__s + (ulong)uVar3 * 4) = iVar4;
    }
    else {
      Gia_ObjSetRepr(p,iVar4,Num);
    }
  }
  lVar12 = lVar12 + 1;
  uVar3 = p->nObjs;
  goto LAB_005271e6;
}

Assistant:

void Cec3_ManCreateClasses( Gia_Man_t * p, Cec3_Man_t * pMan )
{
    abctime clk;
    Gia_Obj_t * pObj;
    int nWords = p->nSimWords;
    int * pTable, nTableSize, i, Key;
    // allocate representation
    ABC_FREE( p->pReprs );
    ABC_FREE( p->pNexts );
    p->pReprs = ABC_CALLOC( Gia_Rpr_t, Gia_ManObjNum(p) );
    p->pNexts = ABC_FALLOC( int, Gia_ManObjNum(p) );
    // hash each node by its simulation info
    nTableSize = Abc_PrimeCudd( Gia_ManObjNum(p) );
    pTable = ABC_FALLOC( int, nTableSize );
    Gia_ManForEachObj( p, pObj, i )
    {
        p->pReprs[i].iRepr = GIA_VOID;
        if ( Gia_ObjIsCo(pObj) )
            continue;
        Key = Cec3_ManSimHashKey( Cec3_ObjSim(p, i), nWords, nTableSize );
        assert( Key >= 0 && Key < nTableSize );
        if ( pTable[Key] == -1 )
            pTable[Key] = i;
        else
            Gia_ObjSetRepr( p, i, pTable[Key] );
    }
    // create classes
    for ( i = Gia_ManObjNum(p) - 1; i >= 0; i-- )
    {
        int iRepr = Gia_ObjRepr(p, i);
        if ( iRepr == GIA_VOID )
            continue;
        Gia_ObjSetNext( p, i, Gia_ObjNext(p, iRepr) );
        Gia_ObjSetNext( p, iRepr, i );
    }
    ABC_FREE( pTable );
    clk = Abc_Clock();
    Gia_ManForEachClass0( p, i )
        Cec3_ManSimClassRefineOne( p, i );
    pMan->timeRefine += Abc_Clock() - clk;
}